

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O1

int coda_pcre2_substring_nametable_scan_8
              (pcre2_code_8 *code,PCRE2_SPTR8 stringname,PCRE2_SPTR8 *firstptr,PCRE2_SPTR8 *lastptr)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  uint8_t *puVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  PCRE2_SPTR8 str2;
  uint8_t *puVar15;
  ulong uVar16;
  uint uVar17;
  uint local_98;
  
  uVar1 = code->name_entry_size;
  uVar16 = (ulong)uVar1;
  uVar14 = 0;
  uVar12 = (uint)code->name_count;
  do {
    if ((ushort)uVar12 <= (ushort)uVar14) {
      return -0x31;
    }
    uVar10 = (uVar14 & 0xffff) + uVar12 >> 1;
    uVar17 = uVar10 * uVar1;
    uVar11 = (ulong)(uVar17 + 0x88);
    iVar6 = coda__pcre2_strcmp_8(stringname,code->start_bitmap + (uVar11 - 0x26));
    if (iVar6 == 0) {
      lVar3 = uVar11 - 0x28;
      uVar2 = code->name_count;
      str2 = (PCRE2_SPTR8)((long)code + (ulong)uVar17 + (0x8a - uVar16));
      lVar13 = -(ulong)uVar17;
      lVar4 = 0;
      do {
        lVar9 = lVar4;
        lVar8 = lVar13;
        if ((long)uVar11 < 0x89) break;
        uVar11 = uVar11 - uVar16;
        iVar7 = coda__pcre2_strcmp_8(stringname,str2);
        str2 = str2 + -uVar16;
        lVar13 = lVar8 + uVar16;
        lVar4 = lVar9 + uVar16;
      } while (iVar7 == 0);
      puVar5 = code->start_bitmap + lVar3;
      do {
        puVar15 = puVar5;
        lVar13 = lVar9;
        if (code[1].start_bitmap + ((ulong)uVar2 - 1) * uVar16 + -0x28 <= puVar15) break;
        iVar7 = coda__pcre2_strcmp_8(stringname,puVar15 + uVar16 + 2);
        lVar9 = uVar16 + lVar13;
        puVar5 = puVar15 + uVar16;
      } while (iVar7 == 0);
      if (firstptr == (PCRE2_SPTR8 *)0x0) {
        if (lVar13 == 0) {
          uVar2 = *(ushort *)(code->start_bitmap + lVar3);
          local_98 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
          uVar10 = uVar12;
        }
        else {
          local_98 = 0xffffffce;
          uVar10 = uVar12;
        }
      }
      else {
        *firstptr = (PCRE2_SPTR8)((long)code + (0x88 - lVar8));
        *lastptr = puVar15;
        local_98 = (uint)uVar1;
        uVar10 = uVar12;
      }
    }
    else {
      uVar17 = uVar10 + 1;
      if (0 < iVar6) {
        uVar10 = uVar12;
        uVar14 = uVar17;
      }
    }
    uVar12 = uVar10;
    if (iVar6 == 0) {
      return local_98;
    }
  } while( true );
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_nametable_scan(const pcre2_code *code, PCRE2_SPTR stringname,
  PCRE2_SPTR *firstptr, PCRE2_SPTR *lastptr)
{
uint16_t bot = 0;
uint16_t top = code->name_count;
uint16_t entrysize = code->name_entry_size;
PCRE2_SPTR nametable = (PCRE2_SPTR)((char *)code + sizeof(pcre2_real_code));

while (top > bot)
  {
  uint16_t mid = (top + bot) / 2;
  PCRE2_SPTR entry = nametable + entrysize*mid;
  int c = PRIV(strcmp)(stringname, entry + IMM2_SIZE);
  if (c == 0)
    {
    PCRE2_SPTR first;
    PCRE2_SPTR last;
    PCRE2_SPTR lastentry;
    lastentry = nametable + entrysize * (code->name_count - 1);
    first = last = entry;
    while (first > nametable)
      {
      if (PRIV(strcmp)(stringname, (first - entrysize + IMM2_SIZE)) != 0) break;
      first -= entrysize;
      }
    while (last < lastentry)
      {
      if (PRIV(strcmp)(stringname, (last + entrysize + IMM2_SIZE)) != 0) break;
      last += entrysize;
      }
    if (firstptr == NULL) return (first == last)?
      (int)GET2(entry, 0) : PCRE2_ERROR_NOUNIQUESUBSTRING;
    *firstptr = first;
    *lastptr = last;
    return entrysize;
    }
  if (c > 0) bot = mid + 1; else top = mid;
  }

return PCRE2_ERROR_NOSUBSTRING;
}